

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O2

void idx2::Dealloc(encode_data *E)

{
  hash_table<unsigned_int,_idx2::channel> *Ht;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_00;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *Ht_01;
  allocator *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  channel *local_40;
  undefined1 *local_38;
  long local_30;
  
  (*E->Alloc->_vptr_allocator[2])();
  Dealloc<unsigned_long,idx2::brick_volume>(&E->BrickPool);
  Ht = &E->Channels;
  Begin<unsigned_int,idx2::channel>(Ht);
  while (((hash_table<unsigned_int,_idx2::channel> *)local_38 != Ht ||
         (local_30 != 1L << ((byte)(E->Channels).LogCapacity & 0x3f)))) {
    Dealloc(local_40);
    lVar3 = local_30 * 0xd8;
    do {
      lVar4 = lVar3;
      lVar2 = local_30 + 1;
      local_30 = local_30 + 1;
      lVar3 = lVar4 + 0xd8;
    } while (*(char *)(*(long *)(local_38 + 0x10) + lVar2) != '\x02');
    local_40 = (channel *)(*(long *)(local_38 + 8) + 0xd8 + lVar4);
  }
  Dealloc<unsigned_int,idx2::channel>(Ht);
  Ht_00 = &E->SubChannels;
  Begin<unsigned_long,idx2::sub_channel>(Ht_00);
  while (((hash_table<unsigned_long,_idx2::sub_channel> *)local_38 != Ht_00 ||
         (local_30 != 1L << ((byte)(E->SubChannels).LogCapacity & 0x3f)))) {
    Dealloc((sub_channel *)local_40);
    lVar3 = local_30 * 0x70;
    do {
      lVar4 = lVar3;
      lVar2 = local_30 + 1;
      local_30 = local_30 + 1;
      lVar3 = lVar4 + 0x70;
    } while (*(char *)(*(long *)(local_38 + 0x10) + lVar2) != '\x02');
    local_40 = (channel *)(*(long *)(local_38 + 8) + 0x70 + lVar4);
  }
  Dealloc<unsigned_long,idx2::sub_channel>(Ht_00);
  paVar1 = (E->SortedChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedChannels);
  (E->SortedChannels).Size = 0;
  (E->SortedChannels).Capacity = 0;
  paVar1 = (E->SortedSubChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedSubChannels);
  (E->SortedSubChannels).Size = 0;
  (E->SortedSubChannels).Capacity = 0;
  Ht_01 = &E->ChunkMeta;
  Begin<unsigned_long,idx2::chunk_meta_info>(Ht_01);
  while (((hash_table<unsigned_long,_idx2::chunk_meta_info> *)local_38 != Ht_01 ||
         (local_30 != 1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f)))) {
    Dealloc((chunk_meta_info *)local_40);
    lVar3 = local_30 * 0x60;
    do {
      lVar4 = lVar3;
      lVar2 = local_30 + 1;
      local_30 = local_30 + 1;
      lVar3 = lVar4 + 0x60;
    } while (*(char *)(*(long *)(local_38 + 0x10) + lVar2) != '\x02');
    local_40 = (channel *)(*(long *)(local_38 + 8) + 0x60 + lVar4);
  }
  Begin<unsigned_long,idx2::chunk_exp_info>(&E->ChunkExponents);
  while (((hash_table<unsigned_long,_idx2::chunk_exp_info> *)local_38 != &E->ChunkExponents ||
         (local_30 != 1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f)))) {
    Dealloc((chunk_exp_info *)local_40);
    lVar3 = local_30 * 0x90;
    do {
      lVar4 = lVar3;
      lVar2 = local_30 + 1;
      local_30 = local_30 + 1;
      lVar3 = lVar4 + 0x90;
    } while (*(char *)(*(long *)(local_38 + 0x10) + lVar2) != '\x02');
    local_40 = (channel *)(*(long *)(local_38 + 8) + 0x90 + lVar4);
  }
  Dealloc<unsigned_long,idx2::chunk_meta_info>(Ht_01);
  paVar1 = (E->CompressedChunkAddresses).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->CompressedChunkAddresses);
  paVar1 = (E->ChunkStream).Stream.Alloc;
  (E->CompressedChunkAddresses).BitPtr = (E->CompressedChunkAddresses).Stream.Data;
  (E->CompressedChunkAddresses).BitPos = 0;
  (E->CompressedChunkAddresses).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkStream);
  paVar1 = (E->ChunkExpStream).Stream.Alloc;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkExpStream);
  paVar1 = (E->LastSigBlock).Alloc;
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->LastSigBlock);
  (E->LastSigBlock).Size = 0;
  (E->LastSigBlock).Capacity = 0;
  paVar1 = (E->SubbandExps).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SubbandExps);
  (E->SubbandExps).Size = 0;
  (E->SubbandExps).Capacity = 0;
  return;
}

Assistant:

void
Dealloc(encode_data* E)
{
  E->Alloc->DeallocAll();
  Dealloc(&E->BrickPool);
  idx2_ForEach (ChannelIt, E->Channels)
    Dealloc(ChannelIt.Val);
  Dealloc(&E->Channels);
  idx2_ForEach (SubChannelIt, E->SubChannels)
    Dealloc(SubChannelIt.Val);
  Dealloc(&E->SubChannels);
  Dealloc(&E->SortedChannels);
  Dealloc(&E->SortedSubChannels);
  idx2_ForEach (ChunkMetaIt, E->ChunkMeta)
    Dealloc(ChunkMetaIt.Val);
  idx2_ForEach (ChunkExpIt, E->ChunkExponents)
    Dealloc(ChunkExpIt.Val);
  Dealloc(&E->ChunkMeta);
  //Dealloc(&E->CompressedExps);
  Dealloc(&E->CompressedChunkAddresses);
  Dealloc(&E->ChunkStream);
  Dealloc(&E->ChunkExpStream);
  Dealloc(&E->LastSigBlock);
  Dealloc(&E->SubbandExps);
  //Dealloc(&E->BlockStream);
}